

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
          (QGenericArrayOps<FileHeader> *this,FileHeader *b,FileHeader *e)

{
  qsizetype *pqVar1;
  FileHeader *pFVar2;
  long lVar3;
  Data *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  FileHeader *pFVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  
  if ((b != e) && (b < e)) {
    pFVar2 = (this->super_QArrayDataPointer<FileHeader>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<FileHeader>).size;
      uVar23 = (b->h).signature[0];
      uVar24 = (b->h).signature[1];
      uVar25 = (b->h).signature[2];
      uVar26 = (b->h).signature[3];
      uVar27 = (b->h).version_made[0];
      uVar28 = (b->h).version_made[1];
      uVar29 = (b->h).version_needed[0];
      uVar30 = (b->h).version_needed[1];
      uVar31 = (b->h).general_purpose_bits[0];
      uVar32 = (b->h).general_purpose_bits[1];
      uVar33 = (b->h).compression_method[0];
      uVar34 = (b->h).compression_method[1];
      uVar35 = (b->h).last_mod_file[0];
      uVar36 = (b->h).last_mod_file[1];
      uVar37 = (b->h).last_mod_file[2];
      uVar38 = (b->h).last_mod_file[3];
      uVar15 = (b->h).crc_32[0];
      uVar16 = (b->h).crc_32[1];
      uVar17 = (b->h).crc_32[2];
      uVar18 = (b->h).crc_32[3];
      uVar19 = (b->h).compressed_size[0];
      uVar20 = (b->h).compressed_size[1];
      uVar21 = (b->h).compressed_size[2];
      uVar22 = (b->h).compressed_size[3];
      uVar5 = *(undefined8 *)(b->h).uncompressed_size;
      uVar8 = (b->h).extra_field_length[1];
      uVar9 = (b->h).file_comment_length[0];
      uVar10 = (b->h).file_comment_length[1];
      uVar11 = (b->h).disk_start[0];
      uVar12 = (b->h).disk_start[1];
      uVar13 = (b->h).internal_file_attributes[0];
      uVar14 = (b->h).internal_file_attributes[1];
      uVar6 = *(undefined8 *)(b->h).external_file_attributes;
      pFVar7 = pFVar2 + lVar3;
      (pFVar7->h).extra_field_length[0] = (b->h).extra_field_length[0];
      (pFVar7->h).extra_field_length[1] = uVar8;
      (pFVar7->h).file_comment_length[0] = uVar9;
      (pFVar7->h).file_comment_length[1] = uVar10;
      (pFVar7->h).disk_start[0] = uVar11;
      (pFVar7->h).disk_start[1] = uVar12;
      (pFVar7->h).internal_file_attributes[0] = uVar13;
      (pFVar7->h).internal_file_attributes[1] = uVar14;
      *(undefined8 *)((pFVar7->h).extra_field_length + 8) = uVar6;
      pFVar7 = pFVar2 + lVar3;
      (pFVar7->h).crc_32[0] = uVar15;
      (pFVar7->h).crc_32[1] = uVar16;
      (pFVar7->h).crc_32[2] = uVar17;
      (pFVar7->h).crc_32[3] = uVar18;
      (pFVar7->h).compressed_size[0] = uVar19;
      (pFVar7->h).compressed_size[1] = uVar20;
      (pFVar7->h).compressed_size[2] = uVar21;
      (pFVar7->h).compressed_size[3] = uVar22;
      *(undefined8 *)((pFVar7->h).crc_32 + 8) = uVar5;
      pFVar7 = pFVar2 + lVar3;
      (pFVar7->h).signature[0] = uVar23;
      (pFVar7->h).signature[1] = uVar24;
      (pFVar7->h).signature[2] = uVar25;
      (pFVar7->h).signature[3] = uVar26;
      (pFVar7->h).version_made[0] = uVar27;
      (pFVar7->h).version_made[1] = uVar28;
      (pFVar7->h).version_needed[0] = uVar29;
      (pFVar7->h).version_needed[1] = uVar30;
      (pFVar7->h).general_purpose_bits[0] = uVar31;
      (pFVar7->h).general_purpose_bits[1] = uVar32;
      (pFVar7->h).compression_method[0] = uVar33;
      (pFVar7->h).compression_method[1] = uVar34;
      (pFVar7->h).last_mod_file[0] = uVar35;
      (pFVar7->h).last_mod_file[1] = uVar36;
      (pFVar7->h).last_mod_file[2] = uVar37;
      (pFVar7->h).last_mod_file[3] = uVar38;
      pDVar4 = (b->file_name).d.d;
      pFVar2[lVar3].file_name.d.d = pDVar4;
      pFVar2[lVar3].file_name.d.ptr = (b->file_name).d.ptr;
      pFVar2[lVar3].file_name.d.size = (b->file_name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->extra_field).d.d;
      pFVar2[lVar3].extra_field.d.d = pDVar4;
      pFVar2[lVar3].extra_field.d.ptr = (b->extra_field).d.ptr;
      pFVar2[lVar3].extra_field.d.size = (b->extra_field).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar4 = (b->file_comment).d.d;
      pFVar2[lVar3].file_comment.d.d = pDVar4;
      pFVar2[lVar3].file_comment.d.ptr = (b->file_comment).d.ptr;
      pFVar2[lVar3].file_comment.d.size = (b->file_comment).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<FileHeader>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }